

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetDirectoryPropertiesCommand.cxx
# Opt level: O2

bool cmSetDirectoryPropertiesCommand::RunCommand
               (cmMakefile *mf,const_iterator ait,const_iterator aitend,string *errors)

{
  bool bVar1;
  
  do {
    if (ait._M_current == aitend._M_current) {
LAB_0020b349:
      return ait._M_current == aitend._M_current;
    }
    if (((ait._M_current + 1 == aitend._M_current) ||
        (bVar1 = std::operator==(ait._M_current,"VARIABLES"), bVar1)) ||
       (bVar1 = std::operator==(ait._M_current,"MACROS"), bVar1)) {
      std::__cxx11::string::assign((char *)errors);
      goto LAB_0020b349;
    }
    cmMakefile::SetProperty(mf,ait._M_current,ait._M_current[1]._M_dataplus._M_p);
    ait._M_current = ait._M_current + 2;
  } while( true );
}

Assistant:

bool cmSetDirectoryPropertiesCommand::RunCommand(
  cmMakefile* mf, std::vector<std::string>::const_iterator ait,
  std::vector<std::string>::const_iterator aitend, std::string& errors)
{
  for (; ait != aitend; ait += 2) {
    if (ait + 1 == aitend) {
      errors = "Wrong number of arguments";
      return false;
    }
    const std::string& prop = *ait;
    const std::string& value = *(ait + 1);
    if (prop == "VARIABLES") {
      errors = "Variables and cache variables should be set using SET command";
      return false;
    }
    if (prop == "MACROS") {
      errors = "Commands and macros cannot be set using SET_CMAKE_PROPERTIES";
      return false;
    }
    mf->SetProperty(prop, value.c_str());
  }

  return true;
}